

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O3

void __thiscall
duckdb::AttachedDatabase::AttachedDatabase
          (AttachedDatabase *this,DatabaseInstance *db,Catalog *catalog_p,string *name_p,
          string *file_path_p,AttachOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *l1;
  AccessMode AVar2;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var3;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var4;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var5;
  AttachedDatabase *db_00;
  AttachOptions *pAVar6;
  bool bVar7;
  _Head_base<0UL,_duckdb::Catalog_*,_false> this_00;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> this_01;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> this_02;
  BinderException *this_03;
  _Hash_node_base *p_Var8;
  char *__end;
  string local_a8;
  AttachedDatabase *local_88;
  AttachOptions *local_80;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (name_p->_M_dataplus)._M_p;
  paVar1 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&name_p->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70._M_string_length = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar1;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  local_78 = file_path_p;
  CatalogEntry::CatalogEntry(&this->super_CatalogEntry,DATABASE_ENTRY,catalog_p,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_02440788;
  this->db = db;
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  (this->parent_catalog).ptr = catalog_p;
  (this->storage_extension).ptr = (StorageExtension *)0x0;
  this->is_initial_database = false;
  this->is_closed = false;
  this->type = (uint)(options->access_mode == READ_ONLY);
  p_Var8 = (options->options)._M_h._M_before_begin._M_nxt;
  local_88 = this;
  local_80 = options;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    paVar1 = &local_a8.field_2;
    do {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"block_size","");
      l1 = (string *)(p_Var8 + 1);
      bVar7 = StringUtil::CIEquals(l1,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if (!bVar7) {
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"encryption_key","");
        bVar7 = StringUtil::CIEquals(l1,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if (!bVar7) {
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"row_group_size","")
          ;
          bVar7 = StringUtil::CIEquals(l1,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if (!bVar7) {
            local_a8._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"storage_version","");
            bVar7 = StringUtil::CIEquals(l1,&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if (!bVar7) {
              this_03 = (BinderException *)__cxa_allocate_exception(0x10);
              local_a8._M_dataplus._M_p = (pointer)paVar1;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Unrecognized option for attach \"%s\"","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,p_Var8[1]._M_nxt,
                         (long)&(p_Var8[1]._M_nxt)->_M_nxt + (long)&(p_Var8[2]._M_nxt)->_M_nxt);
              BinderException::BinderException<std::__cxx11::string>(this_03,&local_a8,&local_50);
              __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  this_00._M_head_impl = (Catalog *)operator_new(0x88);
  db_00 = local_88;
  DuckCatalog::DuckCatalog((DuckCatalog *)this_00._M_head_impl,local_88);
  pAVar6 = local_80;
  _Var3._M_head_impl =
       (db_00->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
       super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
  (db_00->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var3._M_head_impl != (Catalog *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_Catalog + 8))();
  }
  AVar2 = pAVar6->access_mode;
  this_01._M_head_impl = (StorageManager *)operator_new(0x58);
  local_a8._M_dataplus._M_p = (local_78->_M_dataplus)._M_p;
  paVar1 = &local_78->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == paVar1) {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&local_78->field_2 + 8);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a8._M_string_length = local_78->_M_string_length;
  (local_78->_M_dataplus)._M_p = (pointer)paVar1;
  local_78->_M_string_length = 0;
  (local_78->field_2)._M_local_buf[0] = '\0';
  SingleFileStorageManager::SingleFileStorageManager
            ((SingleFileStorageManager *)this_01._M_head_impl,db_00,&local_a8,AVar2 == READ_ONLY);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  _Var4._M_head_impl =
       (db_00->storage).
       super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
       .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl;
  (db_00->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var4._M_head_impl != (StorageManager *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_StorageManager + 8))();
  }
  this_02._M_head_impl = (TransactionManager *)operator_new(0x1b8);
  DuckTransactionManager::DuckTransactionManager
            ((DuckTransactionManager *)this_02._M_head_impl,db_00);
  _Var5._M_head_impl =
       (db_00->transaction_manager).
       super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
       .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
  (db_00->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl = this_02._M_head_impl;
  if (_Var5._M_head_impl != (TransactionManager *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_TransactionManager + 8))();
  }
  (db_00->super_CatalogEntry).internal = true;
  return;
}

Assistant:

AttachedDatabase::AttachedDatabase(DatabaseInstance &db, Catalog &catalog_p, string name_p, string file_path_p,
                                   const AttachOptions &options)
    : CatalogEntry(CatalogType::DATABASE_ENTRY, catalog_p, std::move(name_p)), db(db), parent_catalog(&catalog_p) {

	if (options.access_mode == AccessMode::READ_ONLY) {
		type = AttachedDatabaseType::READ_ONLY_DATABASE;
	} else {
		type = AttachedDatabaseType::READ_WRITE_DATABASE;
	}
	for (auto &entry : options.options) {
		if (StringUtil::CIEquals(entry.first, "block_size")) {
			continue;
		}
		if (StringUtil::CIEquals(entry.first, "encryption_key")) {
			continue;
		}
		if (StringUtil::CIEquals(entry.first, "row_group_size")) {
			continue;
		}
		if (StringUtil::CIEquals(entry.first, "storage_version")) {
			continue;
		}
		throw BinderException("Unrecognized option for attach \"%s\"", entry.first);
	}
	// We create the storage after the catalog to guarantee we allow extensions to instantiate the DuckCatalog.
	catalog = make_uniq<DuckCatalog>(*this);
	auto read_only = options.access_mode == AccessMode::READ_ONLY;
	storage = make_uniq<SingleFileStorageManager>(*this, std::move(file_path_p), read_only);
	transaction_manager = make_uniq<DuckTransactionManager>(*this);
	internal = true;
}